

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlParser.cpp
# Opt level: O0

XMLNode __thiscall XMLParser::XMLNode::getChildNode(XMLNode *this,char *name,int j)

{
  int iVar1;
  int in_ECX;
  int iVar2;
  undefined4 in_register_00000014;
  int local_34;
  int i;
  undefined4 local_28;
  int local_24;
  int i_1;
  int j_local;
  char *name_local;
  XMLNode *this_local;
  
  _i_1 = (int *)CONCAT44(in_register_00000014,j);
  name_local = name;
  this_local = this;
  if (*(long *)name == 0) {
    XMLNode(this,(XMLNode *)&emptyXMLNode);
  }
  else if (in_ECX < 0) {
    local_34 = *(int *)(*(long *)name + 8);
    do {
      iVar2 = local_34 + -1;
      if (local_34 == 0) break;
      iVar1 = xstricmp((char *)_i_1,
                       (char *)**(undefined8 **)(*(long *)(*(long *)name + 0x28) + (long)iVar2 * 8))
      ;
      local_34 = iVar2;
    } while (iVar1 != 0);
    if (iVar2 < 0) {
      XMLNode(this,(XMLNode *)&emptyXMLNode);
    }
    else {
      getChildNode(this,(int)name);
    }
  }
  else {
    local_28 = 0;
    local_24 = in_ECX;
    while (0 < local_24) {
      local_24 = local_24 + -1;
      getChildNode((XMLNode *)&stack0xffffffffffffffd0,name,_i_1);
      ~XMLNode((XMLNode *)&stack0xffffffffffffffd0);
    }
    local_24 = local_24 + -1;
    getChildNode(this,name,_i_1);
  }
  return (XMLNode)(XMLNodeData *)this;
}

Assistant:

XMLNode XMLNode::getChildNode(XMLCSTR name, int j) const
    {
        if(!d)
            return emptyXMLNode;
        if(j >= 0)
        {
            int i = 0;
            while(j-- > 0)
                getChildNode(name, &i);
            return getChildNode(name, &i);
        }
        int i = d->nChild;
        while(i--)
            if(!xstricmp(name, d->pChild[i].d->lpszName))
                break;
        if(i < 0)
            return emptyXMLNode;
        return getChildNode(i);
    }